

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

int djgt__count(djg_texture *texture)

{
  int local_1c;
  djg_texture *pdStack_18;
  int i;
  djg_texture *it;
  djg_texture *texture_local;
  
  local_1c = 0;
  for (pdStack_18 = texture; pdStack_18->next != (djg_texture *)0x0; pdStack_18 = pdStack_18->next)
  {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int djgt__count(const djg_texture *texture)
{
    const djg_texture *it = texture;
    int i = 0;

    while (it->next) {
        it = it->next;
        ++i;
    }

    return i;
}